

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void __thiscall VmInstruction::AddArgument(VmInstruction *this,VmValue *argument)

{
  uint uVar1;
  VmValue **ppVVar2;
  
  if (argument == (VmValue *)0x0) {
    __assert_fail("argument",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7b8,"void VmInstruction::AddArgument(VmValue *)");
  }
  if ((argument->type).size != 0 || (argument->type).type != VM_TYPE_VOID) {
    uVar1 = (this->arguments).count;
    if (uVar1 == (this->arguments).max) {
      SmallArray<VmValue_*,_4U>::grow(&this->arguments,uVar1);
    }
    ppVVar2 = (this->arguments).data;
    if (ppVVar2 != (VmValue **)0x0) {
      uVar1 = (this->arguments).count;
      (this->arguments).count = uVar1 + 1;
      ppVVar2[uVar1] = argument;
      VmValue::AddUse(argument,&this->super_VmValue);
      return;
    }
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<VmValue *, 4>::push_back(const T &) [T = VmValue *, N = 4]");
  }
  __assert_fail("argument->type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x7b9,"void VmInstruction::AddArgument(VmValue *)");
}

Assistant:

void VmInstruction::AddArgument(VmValue *argument)
{
	assert(argument);
	assert(argument->type != VmType::Void);

	arguments.push_back(argument);

	argument->AddUse(this);
}